

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O0

ON_SubDVertex * __thiscall ON_SubDLevel::AddVertex(ON_SubDLevel *this,ON_SubDVertex *vertex)

{
  ON_SubDVertex *vertex_local;
  ON_SubDLevel *this_local;
  
  (this->m_aggregates).m_bDirtyBoundingBox = true;
  if (vertex == (ON_SubDVertex *)0x0) {
    this_local = (ON_SubDLevel *)0x0;
  }
  else {
    if (this->m_vertex[1] == (ON_SubDVertex *)0x0) {
      this->m_vertex[0] = vertex;
      vertex->m_prev_vertex = (ON_SubDVertex *)0x0;
    }
    else {
      this->m_vertex[1]->m_next_vertex = vertex;
      vertex->m_prev_vertex = this->m_vertex[1];
    }
    this->m_vertex[1] = vertex;
    vertex->m_next_vertex = (ON_SubDVertex *)0x0;
    this->m_vertex_count = this->m_vertex_count + 1;
    ResetVertexArray(this);
    this_local = (ON_SubDLevel *)vertex;
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

const ON_SubDVertex* AddVertex(class ON_SubDVertex* vertex)
  {
    m_aggregates.m_bDirtyBoundingBox = true;
    if (nullptr == vertex)
      return nullptr;
    if (nullptr == m_vertex[1])
    {
      m_vertex[0] = vertex;
      vertex->m_prev_vertex = nullptr;
    }
    else
    {
      m_vertex[1]->m_next_vertex = vertex;
      vertex->m_prev_vertex = m_vertex[1];
    }
    m_vertex[1] = vertex;
    vertex->m_next_vertex = nullptr;
    m_vertex_count++;
    ResetVertexArray();
    return vertex;
  }